

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

char cs_impl::char_cs_ext::from_ascii(numeric *ascii)

{
  numeric_integer nVar1;
  lang_error *this;
  numeric *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [32];
  numeric *local_8;
  
  local_8 = in_RDI;
  nVar1 = cs::numeric::as_integer(in_RDI);
  if (-1 < nVar1) {
    nVar1 = cs::numeric::as_integer(local_8);
    if (nVar1 < 0x100) {
      nVar1 = cs::numeric::as_integer(local_8);
      return (char)nVar1;
    }
  }
  this = (lang_error *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Out of range.",&local_29);
  cs::lang_error::lang_error(this,in_stack_ffffffffffffffa8);
  __cxa_throw(this,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

char from_ascii(const numeric &ascii)
		{
			if (ascii.as_integer() < 0 || ascii.as_integer() > 255)
				throw lang_error("Out of range.");
			return static_cast<char>(ascii.as_integer());
		}